

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void pbrt::createCamera(SP *scene,SP *pbrt)

{
  element_type *peVar1;
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  runtime_error *this;
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  float fVar5;
  float fVar6;
  SP ours;
  shared_ptr<pbrt::syntactic::Camera> camera;
  affine3f frame;
  __shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::make_shared<pbrt::Camera>();
  peVar1 = (pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = &((peVar1->cameras).
             super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((peVar1->cameras).
             super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>;
  if (p_Var4 == p_Var2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"warning: no \'camera\'(s) in pbrt file");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    for (; p_Var4 != p_Var2; p_Var4 = p_Var4 + 1) {
      std::__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&camera.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var4);
      if (camera.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"invalid pbrt camera");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 &camera.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>);
      fVar5 = findCameraFov((SP *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      math::inverse(&frame,&((camera.
                              super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->transform).atStart);
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.z = frame.p.z;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.x = frame.p.x;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_center.y = frame.p.y;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.x = frame.l.vx.x * 0.0;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.y = frame.l.vx.y * 0.0;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_du.z = frame.l.vx.z * 0.0;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.x = frame.l.vy.x * 0.0;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.y = frame.l.vy.y * 0.0;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      lens_dv.z = frame.l.vy.z * 0.0;
      fVar5 = tanf(fVar5 * 0.5 * 0.017453292);
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.x = frame.p.x + frame.l.vz.x;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.y = frame.p.y + frame.l.vz.y;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_center.z = frame.l.vz.z + frame.p.z;
      fVar6 = -1.0 / (0.5 / fVar5);
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.x = fVar6 * frame.l.vx.x;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.y = fVar6 * frame.l.vx.y;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_du.z = fVar6 * frame.l.vx.z;
      fVar5 = 1.0 / (0.5 / fVar5);
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.x = fVar5 * frame.l.vy.x;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.y = fVar5 * frame.l.vy.y;
      ((ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->simplified).
      screen_dv.z = fVar5 * frame.l.vy.z;
      std::vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>::
      push_back(&((scene->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 cameras,&ours);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&camera.super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ours.super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void createCamera(Scene::SP scene, pbrt::syntactic::Scene::SP pbrt)
  {
    Camera::SP ours = std::make_shared<Camera>();
    if (pbrt->cameras.empty()) {
      std::cout << "warning: no 'camera'(s) in pbrt file" << std::endl;
      return;
    }

    for (auto camera : pbrt->cameras) {
      if (!camera)
        throw std::runtime_error("invalid pbrt camera");

      const float fov = findCameraFov(camera);

      // TODO: lensradius and focaldistance:

      //     float 	lensradius 	0 	The radius of the lens. Used to render scenes with depth of field and focus effects. The default value yields a pinhole camera.
      const float lensRadius = 0.f;

      // float 	focaldistance 	10^30 	The focal distance of the lens. If "lensradius" is zero, this has no effect. Otherwise, it specifies the distance from the camera origin to the focal plane.
      const float focalDistance = 1.f;
    
      const affine3f frame = inverse(camera->transform.atStart);
    
      ours->simplified.lens_center = frame.p;
      ours->simplified.lens_du = lensRadius * frame.l.vx;
      ours->simplified.lens_dv = lensRadius * frame.l.vy;

      const float fovDistanceToUnitPlane = 0.5f / tanf(fov/2 * float(M_PI/180.f));
      ours->simplified.screen_center = frame.p + focalDistance * frame.l.vz;
      ours->simplified.screen_du = - focalDistance/fovDistanceToUnitPlane * frame.l.vx;
      ours->simplified.screen_dv = focalDistance/fovDistanceToUnitPlane * frame.l.vy;

      scene->cameras.push_back(ours);
    }
  }